

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathRect(ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,ImDrawFlags flags)

{
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_98;
  float local_84;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  float local_48;
  float local_44;
  float rounding_bl;
  float rounding_br;
  float rounding_tr;
  float rounding_tl;
  ImVec2 local_30;
  uint local_28;
  float local_24;
  ImDrawFlags flags_local;
  float rounding_local;
  ImVec2 *b_local;
  ImVec2 *a_local;
  ImDrawList *this_local;
  
  local_28 = flags;
  local_24 = rounding;
  _flags_local = b;
  b_local = a;
  a_local = (ImVec2 *)this;
  local_28 = FixRectCornerFlags(flags);
  local_84 = 0.5;
  if ((local_28 & 0x30) != 0x30 && (local_28 & 0xc0) != 0xc0) {
    local_84 = 1.0;
  }
  local_24 = ImMin<float>(local_24,ABS(_flags_local->x - b_local->x) * local_84 + -1.0);
  local_98 = 0.5;
  if ((local_28 & 0x50) != 0x50 && (local_28 & 0xa0) != 0xa0) {
    local_98 = 1.0;
  }
  local_24 = ImMin<float>(local_24,ABS(_flags_local->y - b_local->y) * local_98 + -1.0);
  if ((local_24 <= 0.0) || ((local_28 & 0x1f0) == 0x100)) {
    PathLineTo(this,b_local);
    ImVec2::ImVec2(&local_30,_flags_local->x,b_local->y);
    PathLineTo(this,&local_30);
    PathLineTo(this,_flags_local);
    ImVec2::ImVec2((ImVec2 *)&rounding_tr,b_local->x,_flags_local->y);
    PathLineTo(this,(ImVec2 *)&rounding_tr);
  }
  else {
    local_a0 = local_24;
    if ((local_28 & 0x10) == 0) {
      local_a0 = 0.0;
    }
    rounding_br = local_a0;
    local_a4 = local_24;
    if ((local_28 & 0x20) == 0) {
      local_a4 = 0.0;
    }
    rounding_bl = local_a4;
    local_a8 = local_24;
    if ((local_28 & 0x80) == 0) {
      local_a8 = 0.0;
    }
    local_44 = local_a8;
    local_ac = local_24;
    if ((local_28 & 0x40) == 0) {
      local_ac = 0.0;
    }
    local_48 = local_ac;
    ImVec2::ImVec2(&local_50,b_local->x + local_a0,b_local->y + local_a0);
    PathArcToFast(this,&local_50,rounding_br,6,9);
    ImVec2::ImVec2(&local_58,_flags_local->x - rounding_bl,b_local->y + rounding_bl);
    PathArcToFast(this,&local_58,rounding_bl,9,0xc);
    ImVec2::ImVec2(&local_60,_flags_local->x - local_44,_flags_local->y - local_44);
    PathArcToFast(this,&local_60,local_44,0,3);
    ImVec2::ImVec2(&local_68,b_local->x + local_48,_flags_local->y - local_48);
    PathArcToFast(this,&local_68,local_48,3,6);
  }
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, ImDrawFlags flags)
{
    flags = FixRectCornerFlags(flags);
    rounding = ImMin(rounding, ImFabs(b.x - a.x) * ( ((flags & ImDrawFlags_RoundCornersTop)  == ImDrawFlags_RoundCornersTop)  || ((flags & ImDrawFlags_RoundCornersBottom) == ImDrawFlags_RoundCornersBottom) ? 0.5f : 1.0f ) - 1.0f);
    rounding = ImMin(rounding, ImFabs(b.y - a.y) * ( ((flags & ImDrawFlags_RoundCornersLeft) == ImDrawFlags_RoundCornersLeft) || ((flags & ImDrawFlags_RoundCornersRight)  == ImDrawFlags_RoundCornersRight)  ? 0.5f : 1.0f ) - 1.0f);

    if (rounding <= 0.0f || (flags & ImDrawFlags_RoundCornersMask_) == ImDrawFlags_RoundCornersNone)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x, a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x, b.y));
    }
    else
    {
        const float rounding_tl = (flags & ImDrawFlags_RoundCornersTopLeft)     ? rounding : 0.0f;
        const float rounding_tr = (flags & ImDrawFlags_RoundCornersTopRight)    ? rounding : 0.0f;
        const float rounding_br = (flags & ImDrawFlags_RoundCornersBottomRight) ? rounding : 0.0f;
        const float rounding_bl = (flags & ImDrawFlags_RoundCornersBottomLeft)  ? rounding : 0.0f;
        PathArcToFast(ImVec2(a.x + rounding_tl, a.y + rounding_tl), rounding_tl, 6, 9);
        PathArcToFast(ImVec2(b.x - rounding_tr, a.y + rounding_tr), rounding_tr, 9, 12);
        PathArcToFast(ImVec2(b.x - rounding_br, b.y - rounding_br), rounding_br, 0, 3);
        PathArcToFast(ImVec2(a.x + rounding_bl, b.y - rounding_bl), rounding_bl, 3, 6);
    }
}